

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

unsigned_long_long ZSTD_findDecompressedSize(void *src,size_t srcSize)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  unsigned_long_long unaff_R12;
  unsigned_long_long uVar4;
  ulong uVar5;
  bool bVar6;
  ZSTD_frameSizeInfo frameSizeInfo;
  ZSTD_frameHeader local_60;
  
  if (srcSize < 5) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      if ((*src & 0xfffffff0) == 0x184d2a50) {
        uVar1 = 0xffffffffffffffb8;
        if (7 < srcSize) {
          uVar1 = 0xfffffffffffffff2;
          if ((*(uint *)((long)src + 4) >> 3 < 0x1fffffff) &&
             (uVar1 = (ulong)*(uint *)((long)src + 4) + 8, srcSize < uVar1)) {
            uVar1 = 0xffffffffffffffb8;
          }
        }
        if (uVar1 < 0xffffffffffffff89) {
          bVar6 = srcSize < uVar1;
          srcSize = srcSize - uVar1;
          if (bVar6) {
            __assert_fail("skippableSize <= srcSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                          ,0x288,
                          "unsigned long long ZSTD_findDecompressedSize(const void *, size_t)");
          }
          src = (void *)((long)src + uVar1);
          bVar3 = false;
        }
        else {
          unaff_R12 = 0xfffffffffffffffe;
          bVar3 = true;
        }
      }
      else {
        bVar6 = false;
        sVar2 = ZSTD_getFrameHeader_advanced(&local_60,src,srcSize,ZSTD_f_zstd1);
        uVar1 = local_60.frameContentSize;
        if (local_60.frameType == ZSTD_skippableFrame) {
          uVar1 = 0;
        }
        if (sVar2 != 0) {
          uVar1 = 0xfffffffffffffffe;
        }
        if (uVar1 < 0xfffffffffffffffe) {
          uVar1 = uVar1 + uVar5;
          bVar6 = uVar5 <= uVar1;
          if (uVar5 < uVar1) {
            uVar5 = uVar1;
          }
          uVar1 = unaff_R12;
          if (!bVar6) {
            uVar1 = 0xfffffffffffffffe;
          }
        }
        unaff_R12 = uVar1;
        bVar3 = true;
        if (bVar6) {
          ZSTD_findFrameSizeInfo((ZSTD_frameSizeInfo *)&local_60,src,srcSize);
          if (local_60.windowSize < 0xffffffffffffff89) {
            bVar6 = srcSize < local_60.windowSize;
            srcSize = srcSize - local_60.windowSize;
            if (bVar6) {
              __assert_fail("frameSrcSize <= srcSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                            ,0x299,
                            "unsigned long long ZSTD_findDecompressedSize(const void *, size_t)");
            }
            src = (void *)((long)src + local_60.windowSize);
            bVar3 = false;
          }
          else {
            unaff_R12 = 0xfffffffffffffffe;
          }
        }
      }
      if (bVar3) {
        return unaff_R12;
      }
    } while (4 < srcSize);
  }
  uVar4 = 0xfffffffffffffffe;
  if (srcSize == 0) {
    uVar4 = uVar5;
  }
  return uVar4;
}

Assistant:

unsigned long long ZSTD_findDecompressedSize(const void* src, size_t srcSize)
{
    unsigned long long totalDstSize = 0;

    while (srcSize >= ZSTD_startingInputLength(ZSTD_f_zstd1)) {
        U32 const magicNumber = MEM_readLE32(src);

        if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
            size_t const skippableSize = readSkippableFrameSize(src, srcSize);
            if (ZSTD_isError(skippableSize)) return ZSTD_CONTENTSIZE_ERROR;
            assert(skippableSize <= srcSize);

            src = (const BYTE *)src + skippableSize;
            srcSize -= skippableSize;
            continue;
        }

        {   unsigned long long const fcs = ZSTD_getFrameContentSize(src, srcSize);
            if (fcs >= ZSTD_CONTENTSIZE_ERROR) return fcs;

            if (totalDstSize + fcs < totalDstSize)
                return ZSTD_CONTENTSIZE_ERROR; /* check for overflow */
            totalDstSize += fcs;
        }
        /* skip to next frame */
        {   size_t const frameSrcSize = ZSTD_findFrameCompressedSize(src, srcSize);
            if (ZSTD_isError(frameSrcSize)) return ZSTD_CONTENTSIZE_ERROR;
            assert(frameSrcSize <= srcSize);

            src = (const BYTE *)src + frameSrcSize;
            srcSize -= frameSrcSize;
        }
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    if (srcSize) return ZSTD_CONTENTSIZE_ERROR;

    return totalDstSize;
}